

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O3

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::make_constraint<spvtools::opt::DependenceNone>
          (LoopDependenceAnalysis *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var2 = (_List_node_base *)operator_new(0x10);
  p_Var2->_M_prev = (_List_node_base *)0x0;
  p_Var2->_M_next = (_List_node_base *)&PTR_GetType_0093a0e8;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->constraints_).
            super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (Constraint *)
         (this->constraints_).
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }